

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

common_sampler * common_sampler_clone(common_sampler *gsmpl)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  llama_token_data *plVar4;
  bool bVar5;
  undefined7 uVar6;
  common_sampler *this;
  llama_sampler *plVar7;
  
  this = (common_sampler *)operator_new(0x1a0);
  common_params_sampling::common_params_sampling((common_params_sampling *)this,&gsmpl->params);
  plVar7 = (llama_sampler *)llama_sampler_clone(gsmpl->grmr);
  this->grmr = plVar7;
  plVar7 = (llama_sampler *)llama_sampler_clone(gsmpl->chain);
  this->chain = plVar7;
  sVar1 = (gsmpl->prev).sz;
  sVar2 = (gsmpl->prev).first;
  sVar3 = (gsmpl->prev).pos;
  (this->prev).capacity = (gsmpl->prev).capacity;
  (this->prev).sz = sVar1;
  (this->prev).first = sVar2;
  (this->prev).pos = sVar3;
  std::vector<int,_std::allocator<int>_>::vector(&(this->prev).data,&(gsmpl->prev).data);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector(&this->cur,&gsmpl->cur);
  plVar4 = (gsmpl->cur_p).data;
  sVar1 = (gsmpl->cur_p).size;
  bVar5 = (gsmpl->cur_p).sorted;
  uVar6 = *(undefined7 *)&(gsmpl->cur_p).field_0x19;
  (this->cur_p).selected = (gsmpl->cur_p).selected;
  (this->cur_p).sorted = bVar5;
  *(undefined7 *)&(this->cur_p).field_0x19 = uVar6;
  (this->cur_p).data = plVar4;
  (this->cur_p).size = sVar1;
  return this;
}

Assistant:

struct common_sampler * common_sampler_clone(common_sampler * gsmpl) {
    return new common_sampler {
        /* .params = */ gsmpl->params,
        /* .grmr   = */ llama_sampler_clone(gsmpl->grmr),
        /* .chain  = */ llama_sampler_clone(gsmpl->chain),
        /* .prev   = */ gsmpl->prev,
        /* .cur    = */ gsmpl->cur,
        /* .cur_p  = */ gsmpl->cur_p,
    };
}